

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

int __thiscall
MIDIStreamer::FillBuffer(MIDIStreamer *this,int buffer_num,int max_events,DWORD max_time)

{
  byte bVar1;
  DWORD DVar2;
  DWORD *pDVar3;
  uint uVar4;
  int iVar5;
  BYTE courseVol;
  DWORD time;
  DWORD tot_time;
  DWORD *max_event_p;
  DWORD *events;
  int i;
  DWORD max_time_local;
  int max_events_local;
  int buffer_num_local;
  MIDIStreamer *this_local;
  
  if (((this->Restarting & 1U) == 0) &&
     (uVar4 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(), (uVar4 & 1) != 0)) {
    this_local._4_4_ = 1;
  }
  else {
    max_event_p = this->Events[buffer_num];
    pDVar3 = *(DWORD (*) [384])max_event_p;
    if ((this->InitialPlayback & 1U) != 0) {
      this->InitialPlayback = false;
      (*(DWORD (*) [384])max_event_p)[0] = 0;
      (*(DWORD (*) [384])max_event_p)[1] = 0;
      (*(DWORD (*) [384])max_event_p)[2] = 0x80000008;
      (*(DWORD (*) [384])max_event_p)[3] = 0x47f7ff0;
      (*(DWORD (*) [384])max_event_p)[4] = 0xf77f7f01;
      max_event_p = *(DWORD (*) [384])max_event_p + 5;
      (*(this->super_MusInfo)._vptr_MusInfo[0x17])();
    }
    if (((this->VolumeChanged & 1U) != 0) &&
       (((this->super_MusInfo).m_Status != STATE_Paused || (this->NewVolume == 0)))) {
      this->VolumeChanged = false;
      for (events._0_4_ = 0; (int)(uint)events < 0x10; events._0_4_ = (uint)events + 1) {
        bVar1 = this->ChannelVolumes[(int)(uint)events];
        DVar2 = this->NewVolume;
        *max_event_p = 0;
        max_event_p[1] = 0;
        max_event_p[2] = (uint)events | 0x7b0 | ((bVar1 + 1) * DVar2 >> 0x10 & 0xff) << 0x10;
        max_event_p = max_event_p + 3;
      }
    }
    if ((this->super_MusInfo).m_Status == STATE_Paused) {
      uVar4 = MAX<unsigned_int>(1,((max_time / 3) * this->Division) / (uint)this->Tempo);
      *max_event_p = uVar4;
      max_event_p[1] = 0;
      max_event_p[2] = 0x2000000;
      max_event_p._0_4_ = (int)max_event_p + 0xc;
    }
    else {
      if ((this->Restarting & 1U) != 0) {
        this->Restarting = false;
        *max_event_p = 0;
        max_event_p[1] = 0;
        max_event_p[2] = this->InitialTempo | 0x1000000;
        max_event_p = WriteStopNotes(this,max_event_p + 3);
        (*(this->super_MusInfo)._vptr_MusInfo[0x18])();
      }
      max_event_p._0_4_ =
           (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                     (this,max_event_p,pDVar3 + (max_events + -1) * 3,(ulong)max_time);
    }
    memset(this->Buffer + buffer_num,0,0x18);
    this->Buffer[buffer_num].lpData = (BYTE *)(this->Events + buffer_num);
    this->Buffer[buffer_num].dwBufferLength =
         (int)max_event_p - (int)this->Buffer[buffer_num].lpData;
    this->Buffer[buffer_num].dwBytesRecorded = this->Buffer[buffer_num].dwBufferLength;
    iVar5 = (*this->MIDI->_vptr_MIDIDevice[0xc])(this->MIDI,this->Buffer + buffer_num);
    if (iVar5 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = iVar5 << 2 | 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MIDIStreamer::FillBuffer(int buffer_num, int max_events, DWORD max_time)
{
	if (!Restarting && CheckDone())
	{
		return SONG_DONE;
	}

	int i;
	DWORD *events = Events[buffer_num], *max_event_p;
	DWORD tot_time = 0;
	DWORD time = 0;

	// The final event is for a NOP to hold the delay from the last event.
	max_event_p = events + (max_events - 1) * 3;

	if (InitialPlayback)
	{
		InitialPlayback = false;
		// Send the full master volume SysEx message.
		events[0] = 0;								// dwDeltaTime
		events[1] = 0;								// dwStreamID
		events[2] = (MEVT_LONGMSG << 24) | 8;		// dwEvent
		events[3] = MAKE_ID(0xf0,0x7f,0x7f,0x04);	// dwParms[0]
		events[4] = MAKE_ID(0x01,0x7f,0x7f,0xf7);	// dwParms[1]
		events += 5;
		DoInitialSetup();
	}

	// If the volume has changed, stick those events at the start of this buffer.
	if (VolumeChanged && (m_Status != STATE_Paused || NewVolume == 0))
	{
		VolumeChanged = false;
		for (i = 0; i < 16; ++i)
		{
			BYTE courseVol = (BYTE)(((ChannelVolumes[i]+1) * NewVolume) >> 16);
			events[0] = 0;				// dwDeltaTime
			events[1] = 0;				// dwStreamID
			events[2] = MIDI_CTRLCHANGE | i | (7<<8) | (courseVol<<16);
			events += 3;
		}
	}

	// Play nothing while paused.
	if (m_Status == STATE_Paused)
	{
		// Be more responsive when unpausing by only playing each buffer
		// for a third of the maximum time.
		events[0] = MAX<DWORD>(1, (max_time / 3) * Division / Tempo);
		events[1] = 0;
		events[2] = MEVT_NOP << 24;
		events += 3;
	}
	else
	{
		if (Restarting)
		{
			Restarting = false;
			// Reset the tempo to the inital value.
			events[0] = 0;									// dwDeltaTime
			events[1] = 0;									// dwStreamID
			events[2] = (MEVT_TEMPO << 24) | InitialTempo;	// dwEvent
			events += 3;
			// Stop all notes in case any were left hanging.
			events = WriteStopNotes(events);
			DoRestart();
		}
		events = MakeEvents(events, max_event_p, max_time);
	}
	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}